

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::ResultInfo::getExpandedExpression_abi_cxx11_(string *__return_storage_ptr__,ResultInfo *this)

{
  if ((this->m_expr)._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    getExpandedExpressionInternal_abi_cxx11_(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ResultInfo::getExpandedExpression() const {
        return hasExpression() ? getExpandedExpressionInternal() : "";
    }